

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowSpeedTurn.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_3ce7c::LowSpeedTurn::reset(LowSpeedTurn *this)

{
  long *in_RDI;
  int in_stack_00000018;
  float in_stack_0000001c;
  AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *in_stack_00000020;
  float in_stack_ffffffffffffffe4;
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (**(code **)(*in_RDI + 0xe0))((anonymous_namespace)::LowSpeedTurn::startSpeed);
  OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>::setPosition
            ((LocalSpaceMixin<OpenSteer::AbstractVehicle> *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec
             ,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  (**(code **)(*in_RDI + 0xf8))(0x3e99999a);
  (**(code **)(*in_RDI + 0x108))(0x3fc00000);
  (anonymous_namespace)::LowSpeedTurn::startX = (anonymous_namespace)::LowSpeedTurn::startX + 2.0;
  (anonymous_namespace)::LowSpeedTurn::startSpeed =
       (anonymous_namespace)::LowSpeedTurn::startSpeed + 0.15;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
  return;
}

Assistant:

void reset (void)
        {
            // reset vehicle state
            SimpleVehicle::reset ();

            // speed along Forward direction.
            setSpeed (startSpeed);

            // initial position along X axis
            setPosition (startX, 0, 0);

            // steering force clip magnitude
            setMaxForce (0.3f);

            // velocity  clip magnitude
            setMaxSpeed (1.5f);

            // for next instance: step starting location
            startX += 2;

            // for next instance: step speed
            startSpeed += 0.15f;

            // 15 seconds and 150 points along the trail
            setTrailParameters (15, 150);
        }